

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pSVar1;
  pointer pvVar2;
  pointer pAVar3;
  ostream *poVar4;
  pointer pvVar5;
  pointer pSVar6;
  pointer pAVar7;
  int local_964;
  vector<QuadTuple,_std::allocator<QuadTuple>_> quadVec;
  string outputInstDir;
  string outputDAGDir;
  string outputQuadDir;
  string outputLexDir;
  string srcfileName;
  vector<Token,_std::allocator<Token>_> tokenVec;
  vector<QuadTuple,_std::allocator<QuadTuple>_> local_880;
  string outputTableDir;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string outputAsmDir;
  IdentiferTable identiferTable;
  KeyWordTable keyWordTable;
  string local_6d8;
  StringTable stringTable;
  CharTable charTable;
  FloatTable floatTable;
  IntTable intTable;
  DelimiterTable delimiterTable;
  Scanner sc;
  ofstream out;
  Parse parse;
  
  std::__cxx11::string::string((string *)&srcfileName,"../src.txt",(allocator *)&parse);
  std::__cxx11::string::string((string *)&outputLexDir,"../lex.txt",(allocator *)&parse);
  std::__cxx11::string::string((string *)&outputQuadDir,"../quad.txt",(allocator *)&parse);
  std::__cxx11::string::string((string *)&outputAsmDir,"../asm.txt",(allocator *)&parse);
  outputDAGDir._M_dataplus._M_p = (pointer)&outputDAGDir.field_2;
  outputDAGDir._M_string_length = 0;
  outputInstDir._M_dataplus._M_p = (pointer)&outputInstDir.field_2;
  outputInstDir._M_string_length = 0;
  outputTableDir._M_dataplus._M_p = (pointer)&outputTableDir.field_2;
  outputTableDir._M_string_length = 0;
  outputDAGDir.field_2._M_local_buf[0] = '\0';
  outputInstDir.field_2._M_local_buf[0] = '\0';
  outputTableDir.field_2._M_local_buf[0] = '\0';
  if (argc == 0xc) {
    std::__cxx11::string::assign((char *)&srcfileName);
    std::__cxx11::string::assign((char *)&outputLexDir);
    std::__cxx11::string::assign((char *)&outputQuadDir);
    std::__cxx11::string::assign((char *)&outputDAGDir);
    std::__cxx11::string::assign((char *)&outputInstDir);
    std::__cxx11::string::assign((char *)&outputTableDir);
    poVar4 = std::operator<<((ostream *)&std::cout,"srcpath: ");
    poVar4 = std::operator<<(poVar4,(string *)&srcfileName);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"lexPath: ");
    poVar4 = std::operator<<(poVar4,(string *)&outputLexDir);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"quadPath: ");
    poVar4 = std::operator<<(poVar4,(string *)&outputQuadDir);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"targetpath: ");
    poVar4 = std::operator<<(poVar4,(string *)&outputAsmDir);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"outputDAGDir: ");
    poVar4 = std::operator<<(poVar4,(string *)&outputDAGDir);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"outputInstDir: ");
    poVar4 = std::operator<<(poVar4,(string *)&outputInstDir);
    std::endl<char,std::char_traits<char>>(poVar4);
    KeyWordTable::KeyWordTable(&keyWordTable);
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &identiferTable.
          super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .index._M_t._M_impl.super__Rb_tree_header._M_header;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    identiferTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         identiferTable.
         super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    DelimiterTable::DelimiterTable(&delimiterTable);
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header;
    intTable.super_Table<int>.tokenTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    intTable.super_Table<int>.tokenTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    intTable.super_Table<int>.tokenTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header;
    floatTable.super_Table<double>.tokenTable.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    floatTable.super_Table<double>.tokenTable.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    floatTable.super_Table<double>.tokenTable.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header;
    charTable.super_Table<char>.tokenTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    charTable.super_Table<char>.tokenTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charTable.super_Table<char>.tokenTable.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &stringTable.
          super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .index._M_t._M_impl.super__Rb_tree_header._M_header;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    tokenTable.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tokenVec.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    quadVec.super__Vector_base<QuadTuple,_std::allocator<QuadTuple>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    stringTable.
    super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         stringTable.
         super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         charTable.super_Table<char>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         floatTable.super_Table<double>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         intTable.super_Table<int>.index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Scanner::Scanner(&sc,&keyWordTable,&identiferTable,&delimiterTable,&intTable,&floatTable,
                     &charTable,&stringTable,&tokenVec,&symbolTable);
    std::__cxx11::string::string((string *)&local_7a8,(string *)&srcfileName);
    Scanner::scan(&sc,&local_7a8);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::string((string *)&local_7c8,(string *)&outputLexDir);
    Scanner::showLex(&sc,&local_7c8);
    std::__cxx11::string::~string((string *)&local_7c8);
    Parse::Parse(&parse,&quadVec,&tokenVec,&symbolTable,&keyWordTable,&identiferTable,
                 &delimiterTable,&intTable,&floatTable,&charTable,&stringTable);
    Parse::parse(&parse);
    std::__cxx11::string::string((string *)&local_7e8,(string *)&outputQuadDir);
    Parse::print(&parse,&local_7e8);
    std::__cxx11::string::~string((string *)&local_7e8);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::vector(&local_880,&quadVec);
    std::__cxx11::string::string((string *)&local_808,(string *)&outputDAGDir);
    std::__cxx11::string::string((string *)&local_828,(string *)&outputInstDir);
    test(&local_880,&local_808,&local_828);
    std::__cxx11::string::~string((string *)&local_828);
    std::__cxx11::string::~string((string *)&local_808);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::~vector(&local_880);
    std::ofstream::ofstream(&out);
    std::ofstream::open((string *)&out,(_Ios_Openmode)&outputTableDir);
    pvVar2 = symbolTable.symbolTable.
             super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_964 = 0;
    for (pvVar5 = symbolTable.symbolTable.
                  super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar2; pvVar5 = pvVar5 + 1)
    {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&out,local_964);
      poVar4 = std::operator<<(poVar4,":");
      std::endl<char,std::char_traits<char>>(poVar4);
      local_964 = local_964 + 1;
      pSVar1 = (pvVar5->super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pSVar6 = (pvVar5->
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
                    _M_impl.super__Vector_impl_data._M_start; pSVar6 != pSVar1; pSVar6 = pSVar6 + 1)
      {
        poVar4 = std::operator<<((ostream *)&out,(string *)pSVar6);
        poVar4 = std::operator<<(poVar4," ");
        Parse::toSymTypeName_abi_cxx11_(&local_848,&parse,&pSVar6->type);
        poVar4 = std::operator<<(poVar4,(string *)&local_848);
        poVar4 = std::operator<<(poVar4," ");
        Parse::toCatName_abi_cxx11_(&local_6d8,&parse,pSVar6->cat);
        poVar4 = std::operator<<(poVar4,(string *)&local_6d8);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pSVar6->vall);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_848);
      }
    }
    poVar4 = std::operator<<((ostream *)&out,anon_var_dwarf_53b97);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&out,"Low ");
    poVar4 = std::operator<<(poVar4,"up ");
    poVar4 = std::operator<<(poVar4,"clen ");
    poVar4 = std::operator<<(poVar4,"type ");
    std::endl<char,std::char_traits<char>>(poVar4);
    pAVar3 = symbolTable.arrayTableVec.super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pAVar7 = symbolTable.arrayTableVec.
                  super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>._M_impl.
                  super__Vector_impl_data._M_start; pAVar7 != pAVar3; pAVar7 = pAVar7 + 1) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&out);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," ");
      Parse::toSymTypeName_abi_cxx11_(&local_848,&parse,&pAVar7->type);
      poVar4 = std::operator<<(poVar4,(string *)&local_848);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_848);
    }
    poVar4 = std::operator<<((ostream *)&out,anon_var_dwarf_53bf8);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    Parse::~Parse(&parse);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::~vector(&quadVec);
    std::vector<Token,_std::allocator<Token>_>::~vector(&tokenVec);
    Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Table
              (&stringTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
    Table<char>::~Table(&charTable.super_Table<char>);
    Table<double>::~Table(&floatTable.super_Table<double>);
    Table<int>::~Table(&intTable.super_Table<int>);
    Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Table
              (&delimiterTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
    Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Table
              (&identiferTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
    Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Table
              (&keyWordTable.
                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Invaild filename");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&outputTableDir);
  std::__cxx11::string::~string((string *)&outputInstDir);
  std::__cxx11::string::~string((string *)&outputDAGDir);
  std::__cxx11::string::~string((string *)&outputAsmDir);
  std::__cxx11::string::~string((string *)&outputQuadDir);
  std::__cxx11::string::~string((string *)&outputLexDir);
  std::__cxx11::string::~string((string *)&srcfileName);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    /*
     * 词法分析结果的输出
     */
    string srcfileName = "../src.txt";
    string outputLexDir = "../lex.txt";
    string outputQuadDir = "../quad.txt";
    string outputAsmDir = "../asm.txt";
    string outputDAGDir;
    string outputInstDir;
    string outputTableDir;
    if(argc != 12) {
        cout << "Invaild filename" << endl;
        return 0;
    } else {
        srcfileName = argv[1];
        outputLexDir = argv[3];
        outputQuadDir = argv[5];
        outputDAGDir = argv[7];
        outputInstDir = argv[9];
        outputTableDir = argv[11];
        cout << "srcpath: " << srcfileName << endl;
        cout << "lexPath: " << outputLexDir << endl;
        cout << "quadPath: " << outputQuadDir << endl;
        cout << "targetpath: " << outputAsmDir << endl;
        cout << "outputDAGDir: " << outputDAGDir << endl;
        cout << "outputInstDir: " << outputInstDir << endl;
    }
    KeyWordTable keyWordTable;
    IdentiferTable identiferTable;
    DelimiterTable delimiterTable;
    IntTable intTable;
    FloatTable floatTable;
    CharTable charTable;
    StringTable stringTable;
    vector<Token> tokenVec;
    vector<QuadTuple> quadVec;
    Scanner sc(keyWordTable, identiferTable, delimiterTable, intTable, floatTable, charTable, stringTable, tokenVec, symbolTable);
    sc.scan(srcfileName);
    sc.showLex(outputLexDir);
//    fclose(stdout);
//    cout << tokenVec.size() << endl;
    //symbolTable.print();
    /*
    Parse::Parse(vector<QuadTurple> &quadVec, vector<Token> &tokenVec, SymbolTable &st, KeyWordTable &kt,
                 IdentiferTable &it, DelimiterTable &dt, IntTable &inTable, FloatTable &ft, CharTable &ct,
                 StringTable &stTable) : quadVec(quadVec), tokenVec(tokenVec), st(st), keyWordTable(kt), identiferTable(it), delimiterTable(dt), intTable(inTable), floatTable(ft), charTable(ct), stringTable(stTable){
        this->curIndex = 0;
        this->curFun = -1;
        this->funCnt = 0;
    }
    */
    Parse parse(quadVec, tokenVec, symbolTable, keyWordTable, identiferTable, delimiterTable, intTable, floatTable, charTable, stringTable);
    parse.parse();
    parse.print(outputQuadDir);
    test(quadVec, outputDAGDir, outputInstDir);
    //symbolTable.print();
    int index = 0;
    int cur;
    ofstream out;
    out.open(outputTableDir, ios::out | ios::trunc);
    for (auto &i : symbolTable.symbolTable) {
        out << index++  << ":" << endl;
        cur = 0;
        for (auto &j : i) {
            out  << j.name << " " << parse.toSymTypeName(j.type) <<  " " <<  parse.toCatName(j.cat) << " " << j.vall<< endl;
        }
    }
    out << "数组表" << endl;
    out << "Low " <<"up " << "clen " << "type " << endl;
    for (auto &i : symbolTable.arrayTableVec) {
        out << i.low << " " << i.up << " " << i.clen << " " << parse.toSymTypeName(i.type) << endl;
    }


    out << "函数表" << endl;
//    out << "Low " <<"up " << "clen " << "type " << endl;
//    for (auto &i : symbolTable.functionTableVec) {
//        out << i.paramNum << " " << i. << " " << i.clen << " " << parse.toSymTypeName(i.type) << endl;
//    }
    out.close();
//    test(quadVec);
    //cout << symbolTable.isTempName("t5", "main") << endl;
//    cout << symbolTable.getAddr("a", "main").first << " " << symbolTable.getAddr("a", "main").second << endl;
    return 0;
}